

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O0

void Omega_h::vtk::read_vtu_ents(istream *stream,Mesh *mesh)

{
  size_t *this;
  Int IVar1;
  bool bVar2;
  undefined1 local_698 [8];
  Tag tag10;
  Tag tag9;
  Tag tag8;
  string local_588 [39];
  allocator local_561;
  string local_560 [32];
  Read<long> local_540;
  Read<long> local_530;
  Read<int> local_520;
  allocator local_509;
  string local_508 [32];
  Read<long> local_4e8;
  allocator local_4d1;
  string local_4d0 [32];
  Read<long> local_4b0;
  undefined1 local_4a0 [8];
  GOs elem_globals;
  Tag tag7;
  string local_430 [39];
  allocator local_409;
  string local_408 [32];
  Read<double> local_3e8;
  allocator local_3d1;
  string local_3d0 [32];
  Read<long> local_3b0;
  allocator local_399;
  string local_398 [32];
  Read<long> local_378;
  allocator local_361;
  string local_360 [32];
  Read<long> local_340;
  undefined1 local_330 [8];
  GOs vert_globals;
  Tag tag6;
  Tag tag5;
  Read<double> local_260;
  allocator local_249;
  string local_248 [32];
  undefined1 local_228 [8];
  Read<double> coords;
  Tag tag4;
  Tag tag3;
  undefined1 local_158 [8];
  LOs ev2v;
  Int dim;
  Omega_h_Family family;
  CommPtr comm;
  Tag tag2;
  LO local_d0;
  LO ncells;
  LO nverts;
  undefined1 local_c0 [8];
  Tag tag1;
  bool is_compressed;
  bool needs_swapping;
  Mesh *mesh_local;
  istream *stream_local;
  
  read_vtkfile_vtu_start_tag
            (stream,(bool *)((long)&tag1.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count +
                            7),
             (bool *)((long)&tag1.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count + 6));
  xml_lite::read_tag((Tag *)local_c0,stream);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_c0,"UnstructuredGrid");
  if (!bVar2) {
    fail("assertion %s failed at %s +%d\n","tag1.elem_name == \"UnstructuredGrid\"",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
         ,0x299);
  }
  read_piece_start_tag
            (stream,&local_d0,
             (LO *)((long)&tag2.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
  xml_lite::read_tag((Tag *)&comm.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,stream);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &comm.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,"Cells");
  if (!bVar2) {
    fail("assertion %s failed at %s +%d\n","tag2.elem_name == \"Cells\"",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
         ,0x29d);
  }
  Omega_h::Mesh::comm((Mesh *)&dim);
  local_158 = (undefined1  [8])0x0;
  ev2v.write_.shared_alloc_.alloc = (Alloc *)0x0;
  this = &tag3.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::shared_ptr<Omega_h::Comm>::shared_ptr
            ((shared_ptr<Omega_h::Comm> *)this,(shared_ptr<Omega_h::Comm> *)&dim);
  read_connectivity(stream,(CommPtr *)this,
                    tag2.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
                    (bool)(tag1.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1),
                    (bool)(tag1.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1),
                    (Omega_h_Family *)((long)&ev2v.write_.shared_alloc_.direct_ptr + 4),
                    (Int *)&ev2v.write_.shared_alloc_.direct_ptr,(LOs *)local_158);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr
            ((shared_ptr<Omega_h::Comm> *)
             &tag3.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Omega_h::Mesh::set_family(mesh,ev2v.write_.shared_alloc_.direct_ptr._4_4_);
  Omega_h::Mesh::set_dim(mesh,(Int)ev2v.write_.shared_alloc_.direct_ptr);
  xml_lite::read_tag((Tag *)&tag4.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count,stream);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &tag4.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count,"Cells");
  if (!bVar2) {
    fail("assertion %s failed at %s +%d\n","tag3.elem_name == \"Cells\"",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
         ,0x2a7);
  }
  xml_lite::read_tag((Tag *)&coords.write_.shared_alloc_.direct_ptr,stream);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &coords.write_.shared_alloc_.direct_ptr,"Points");
  if (!bVar2) {
    fail("assertion %s failed at %s +%d\n","tag4.elem_name == \"Points\"",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
         ,0x2a9);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"coordinates",&local_249);
  read_known_array<double>
            ((vtk *)local_228,stream,(string *)local_248,local_d0,3,
             (bool)(tag1.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1),
             (bool)(tag1.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1));
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  if ((Int)ev2v.write_.shared_alloc_.direct_ptr < 3) {
    Read<double>::Read((Read<double> *)
                       &tag5.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (Read<double> *)local_228);
    resize_vectors((Omega_h *)&local_260,
                   (Reals *)&tag5.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count,3,
                   (Int)ev2v.write_.shared_alloc_.direct_ptr);
    Read<double>::operator=((Read<double> *)local_228,&local_260);
    Read<double>::~Read(&local_260);
    Read<double>::~Read((Read<double> *)
                        &tag5.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  xml_lite::read_tag((Tag *)&tag6.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count,stream);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &tag6.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count,"Points");
  if (!bVar2) {
    fail("assertion %s failed at %s +%d\n","tag5.elem_name == \"Points\"",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
         ,0x2ae);
  }
  xml_lite::read_tag((Tag *)&vert_globals.write_.shared_alloc_.direct_ptr,stream);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &vert_globals.write_.shared_alloc_.direct_ptr,"PointData");
  if (!bVar2) {
    fail("assertion %s failed at %s +%d\n","tag6.elem_name == \"PointData\"",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
         ,0x2b0);
  }
  local_330 = (undefined1  [8])0x0;
  vert_globals.write_.shared_alloc_.alloc = (Alloc *)0x0;
  bVar2 = Omega_h::Mesh::could_be_shared(mesh,0);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_360,"global",&local_361);
    read_known_array<long>
              ((vtk *)&local_340,stream,(string *)local_360,local_d0,1,
               (bool)(tag1.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1),
               (bool)(tag1.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1));
    Read<long>::operator=((Read<long> *)local_330,&local_340);
    Read<long>::~Read(&local_340);
    std::__cxx11::string::~string(local_360);
    std::allocator<char>::~allocator((allocator<char> *)&local_361);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_398,"",&local_399);
    Read<long>::Read(&local_378,local_d0,0,1,(string *)local_398);
    Read<long>::operator=((Read<long> *)local_330,&local_378);
    Read<long>::~Read(&local_378);
    std::__cxx11::string::~string(local_398);
    std::allocator<char>::~allocator((allocator<char> *)&local_399);
  }
  Read<long>::Read(&local_3b0,(Read<int> *)local_330);
  build_verts_from_globals(mesh,&local_3b0);
  Read<long>::~Read(&local_3b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d0,"coordinates",&local_3d1);
  IVar1 = (Int)ev2v.write_.shared_alloc_.direct_ptr;
  Read<double>::Read(&local_3e8,(Read<double> *)local_228);
  Omega_h::Mesh::add_tag<double>(mesh,0,(string *)local_3d0,IVar1,&local_3e8,true);
  Read<double>::~Read(&local_3e8);
  std::__cxx11::string::~string(local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  do {
    bVar2 = read_tag(stream,mesh,0,
                     (bool)(tag1.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1)
                     ,(bool)(tag1.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1
                            ));
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_408,"local",&local_409);
  Omega_h::Mesh::remove_tag(mesh,0,(string *)local_408);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_430,"owner",
             (allocator *)((long)&tag7.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count + 7)
            );
  Omega_h::Mesh::remove_tag(mesh,0,(string *)local_430);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tag7.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  xml_lite::read_tag((Tag *)&elem_globals.write_.shared_alloc_.direct_ptr,stream);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &elem_globals.write_.shared_alloc_.direct_ptr,"CellData");
  if (!bVar2) {
    fail("assertion %s failed at %s +%d\n","tag7.elem_name == \"CellData\"",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
         ,0x2bf);
  }
  local_4a0 = (undefined1  [8])0x0;
  elem_globals.write_.shared_alloc_.alloc = (Alloc *)0x0;
  bVar2 = Omega_h::Mesh::could_be_shared(mesh,(Int)ev2v.write_.shared_alloc_.direct_ptr);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4d0,"global",&local_4d1);
    read_known_array<long>
              ((vtk *)&local_4b0,stream,(string *)local_4d0,
               tag2.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,1,
               (bool)(tag1.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1),
               (bool)(tag1.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1));
    Read<long>::operator=((Read<long> *)local_4a0,&local_4b0);
    Read<long>::~Read(&local_4b0);
    std::__cxx11::string::~string(local_4d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_508,"",&local_509);
    Read<long>::Read(&local_4e8,tag2.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
                     0,1,(string *)local_508);
    Read<long>::operator=((Read<long> *)local_4a0,&local_4e8);
    Read<long>::~Read(&local_4e8);
    std::__cxx11::string::~string(local_508);
    std::allocator<char>::~allocator((allocator<char> *)&local_509);
  }
  Read<int>::Read(&local_520,(Read<int> *)local_158);
  Read<long>::Read(&local_530,(Read<int> *)local_330);
  Read<long>::Read(&local_540,(Read<int> *)local_4a0);
  build_ents_from_elems2verts(mesh,&local_520,&local_530,&local_540);
  Read<long>::~Read(&local_540);
  Read<long>::~Read(&local_530);
  Read<int>::~Read(&local_520);
  do {
    bVar2 = read_tag(stream,mesh,(Int)ev2v.write_.shared_alloc_.direct_ptr,
                     (bool)(tag1.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1)
                     ,(bool)(tag1.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1
                            ));
    IVar1 = (Int)ev2v.write_.shared_alloc_.direct_ptr;
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_560,"local",&local_561);
  Omega_h::Mesh::remove_tag(mesh,IVar1,(string *)local_560);
  std::__cxx11::string::~string(local_560);
  std::allocator<char>::~allocator((allocator<char> *)&local_561);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_588,"owner",
             (allocator *)((long)&tag8.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count + 7)
            );
  Omega_h::Mesh::remove_tag(mesh,(Int)ev2v.write_.shared_alloc_.direct_ptr,(string *)local_588);
  std::__cxx11::string::~string(local_588);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tag8.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  xml_lite::read_tag((Tag *)&tag9.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count,stream);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &tag9.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count,"Piece");
  if (!bVar2) {
    fail("assertion %s failed at %s +%d\n","tag8.elem_name == \"Piece\"",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
         ,0x2cd);
  }
  xml_lite::read_tag((Tag *)&tag10.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count,stream);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &tag10.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          "UnstructuredGrid");
  if (!bVar2) {
    fail("assertion %s failed at %s +%d\n","tag9.elem_name == \"UnstructuredGrid\"",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
         ,0x2cf);
  }
  xml_lite::read_tag((Tag *)local_698,stream);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_698,"VTKFile");
  if (bVar2) {
    xml_lite::Tag::~Tag((Tag *)local_698);
    xml_lite::Tag::~Tag((Tag *)&tag10.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    xml_lite::Tag::~Tag((Tag *)&tag9.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    Read<long>::~Read((Read<long> *)local_4a0);
    xml_lite::Tag::~Tag((Tag *)&elem_globals.write_.shared_alloc_.direct_ptr);
    Read<long>::~Read((Read<long> *)local_330);
    xml_lite::Tag::~Tag((Tag *)&vert_globals.write_.shared_alloc_.direct_ptr);
    xml_lite::Tag::~Tag((Tag *)&tag6.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    Read<double>::~Read((Read<double> *)local_228);
    xml_lite::Tag::~Tag((Tag *)&coords.write_.shared_alloc_.direct_ptr);
    xml_lite::Tag::~Tag((Tag *)&tag4.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    Read<int>::~Read((Read<int> *)local_158);
    std::shared_ptr<Omega_h::Comm>::~shared_ptr((shared_ptr<Omega_h::Comm> *)&dim);
    xml_lite::Tag::~Tag((Tag *)&comm.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
    xml_lite::Tag::~Tag((Tag *)local_c0);
    return;
  }
  fail("assertion %s failed at %s +%d\n","tag10.elem_name == \"VTKFile\"",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
       ,0x2d1);
}

Assistant:

void read_vtu_ents(std::istream& stream, Mesh* mesh) {
  bool needs_swapping, is_compressed;
  read_vtkfile_vtu_start_tag(stream, &needs_swapping, &is_compressed);
  auto tag1 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag1.elem_name == "UnstructuredGrid");
  LO nverts, ncells;
  read_piece_start_tag(stream, &nverts, &ncells);
  auto tag2 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag2.elem_name == "Cells");
  auto comm = mesh->comm();
  Omega_h_Family family;
  Int dim;
  LOs ev2v;
  read_connectivity(stream, comm, ncells, needs_swapping, is_compressed,
      &family, &dim, &ev2v);
  mesh->set_family(family);
  mesh->set_dim(dim);
  auto tag3 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag3.elem_name == "Cells");
  auto tag4 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag4.elem_name == "Points");
  auto coords = read_known_array<Real>(
      stream, "coordinates", nverts, 3, needs_swapping, is_compressed);
  if (dim < 3) coords = resize_vectors(coords, 3, dim);
  auto tag5 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag5.elem_name == "Points");
  auto tag6 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag6.elem_name == "PointData");
  GOs vert_globals;
  if (mesh->could_be_shared(VERT)) {
    vert_globals = read_known_array<GO>(
        stream, "global", nverts, 1, needs_swapping, is_compressed);
  } else {
    vert_globals = Read<GO>(nverts, 0, 1);
  }
  build_verts_from_globals(mesh, vert_globals);
  mesh->add_tag(VERT, "coordinates", dim, coords, true);
  while (read_tag(stream, mesh, VERT, needs_swapping, is_compressed))
    ;
  mesh->remove_tag(VERT, "local");
  mesh->remove_tag(VERT, "owner");
  auto tag7 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag7.elem_name == "CellData");
  GOs elem_globals;
  if (mesh->could_be_shared(dim)) {
    elem_globals = read_known_array<GO>(
        stream, "global", ncells, 1, needs_swapping, is_compressed);
  } else {
    elem_globals = Read<GO>(ncells, 0, 1);
  }
  build_ents_from_elems2verts(mesh, ev2v, vert_globals, elem_globals);
  while (read_tag(stream, mesh, dim, needs_swapping, is_compressed))
    ;
  mesh->remove_tag(dim, "local");
  mesh->remove_tag(dim, "owner");
  auto tag8 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag8.elem_name == "Piece");
  auto tag9 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag9.elem_name == "UnstructuredGrid");
  auto tag10 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag10.elem_name == "VTKFile");
}